

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  char *end;
  char error_buf [200];
  char *local_f0;
  char local_e8 [208];
  
  local_f0 = argv[1];
  if ((argc == 2) &&
     ((uVar1 = strtol(local_f0,&local_f0,10), *local_f0 == '\0' ||
      (uVar1 = strtol(argv[1],&local_f0,0x10), *local_f0 == '\0')))) {
    if (uVar1 != 0) {
      uVar2 = -uVar1;
      if (0 < (long)uVar1) {
        uVar2 = uVar1;
      }
      mbedtls_strerror(-(int)uVar2,local_e8,200);
      printf("Last error was: -0x%04x - %s\n\n",uVar2 & 0xffffffff,local_e8);
      return -(int)uVar2;
    }
  }
  else {
    puts(
        "\n usage: strerror <errorcode>\n\n where <errorcode> can be a decimal or hexadecimal (starts with 0x or -0x)"
        );
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
    long int val;
    char *end = argv[1];

    if( argc != 2 )
    {
        mbedtls_printf( USAGE );
        return( 0 );
    }

    val = strtol( argv[1], &end, 10 );
    if( *end != '\0' )
    {
        val = strtol( argv[1], &end, 16 );
        if( *end != '\0' )
        {
            mbedtls_printf( USAGE );
            return( 0 );
        }
    }
    if( val > 0 )
        val = -val;

    if( val != 0 )
    {
        char error_buf[200];
        mbedtls_strerror( val, error_buf, 200 );
        mbedtls_printf("Last error was: -0x%04x - %s\n\n", (int) -val, error_buf );
    }

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( val );
}